

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetDeviceOutputSubsamples
          (VClient *this,string *i_rDeviceName,string *i_rDeviceOutputName,string *i_rComponentName,
          uint *o_rDeviceOutputSubsamples,bool *o_rbOccluded)

{
  long lVar1;
  size_t sVar2;
  string *psVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pVVar6;
  pointer pVVar7;
  VClient *pVVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  VDeviceInfo *pVVar12;
  UInt64 UVar13;
  ulong uVar14;
  ulong uVar15;
  pointer pVVar16;
  pointer pVVar17;
  pointer pVVar18;
  pointer pVVar19;
  char *pcVar20;
  Enum EVar21;
  string *i_rDeviceOutputName_00;
  VChannelInfo *rChannel;
  ulong uVar22;
  VClient *this_00;
  uint i_DeviceOutputIndex;
  bool bVar23;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_c4;
  uint *local_c0;
  Enum local_b4;
  long local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  UInt64 local_90;
  uint local_84;
  VClient *local_80;
  string *local_78;
  bool *local_70;
  VChannelInfo *local_68;
  unique_lock<boost::recursive_mutex> local_60;
  undefined1 local_50 [32];
  
  local_60.m = &this->m_FrameMutex;
  local_60.is_locked = false;
  local_78 = i_rDeviceOutputName;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_60);
  local_c4 = Success;
  ClientUtils::Clear(o_rDeviceOutputSubsamples);
  bVar9 = InitGet(this,&local_c4);
  EVar21 = local_c4;
  if ((bVar9) &&
     (pVVar12 = GetDevice(this,i_rDeviceName,&local_c4), EVar21 = local_c4,
     pVVar12 != (VDeviceInfo *)0x0)) {
    local_84 = pVVar12->m_DeviceID;
    local_90 = pVVar12->m_FramePeriod;
    local_c0 = o_rDeviceOutputSubsamples;
    UVar13 = GetDeviceStartTick(this,local_84);
    rChannel = (this->m_LatestFrame).m_Channels.
               super__Vector_base<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_68 = (this->m_LatestFrame).m_Channels.
               super__Vector_base<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (rChannel != local_68) {
      lVar1 = (this->m_LatestFrame).m_Stream.m_FramePeriod;
      local_a0 = (ulong)(this->m_LatestFrame).m_Frame.m_FrameID * lVar1;
      local_98 = lVar1 + local_a0;
      local_b0 = local_a0 + ~UVar13;
      local_a8 = ~UVar13 + local_98;
      i_DeviceOutputIndex = 0;
      local_80 = this;
      local_70 = o_rbOccluded;
LAB_0012f2b5:
      bVar9 = false;
      if ((rChannel->m_DeviceID == local_84) &&
         ((local_78->_M_string_length == 0 ||
          ((sVar2 = (rChannel->m_Name)._M_string_length, sVar2 == local_78->_M_string_length &&
           ((sVar2 == 0 ||
            (iVar10 = bcmp((rChannel->m_Name)._M_dataplus._M_p,(local_78->_M_dataplus)._M_p,sVar2),
            iVar10 == 0)))))))) {
        i_rDeviceOutputName_00 =
             (rChannel->m_ComponentNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        psVar3 = (rChannel->m_ComponentNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (i_rDeviceOutputName_00 == psVar3) {
          local_b4 = NoFrame;
          bVar9 = true;
        }
        else {
          do {
            ClientUtils::AdaptDeviceOutputName
                      ((string *)local_50,i_rDeviceOutputName_00,i_DeviceOutputIndex);
            sVar2 = i_rComponentName->_M_string_length;
            if (sVar2 == local_50._8_8_) {
              if (sVar2 == 0) {
                bVar9 = true;
              }
              else {
                iVar10 = bcmp((i_rComponentName->_M_dataplus)._M_p,(void *)local_50._0_8_,sVar2);
                bVar9 = iVar10 == 0;
              }
            }
            else {
              bVar9 = false;
            }
            this_00 = (VClient *)local_50._0_8_;
            if ((VClient *)local_50._0_8_ != (VClient *)(local_50 + 0x10)) {
              operator_delete((void *)local_50._0_8_);
            }
            if (bVar9) {
              bVar9 = IsForcePlateForceChannel(this_00,rChannel);
              if (bVar9) {
                pVVar16 = (local_80->m_LatestFrame).m_Forces.
                          super__Vector_base<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pVVar4 = (local_80->m_LatestFrame).m_Forces.
                         super__Vector_base<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                *local_c0 = 0;
                bVar23 = pVVar16 != pVVar4;
                if (pVVar16 == pVVar4) goto LAB_0012f67c;
                uVar22 = (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
                bVar23 = true;
                goto LAB_0012f3ee;
              }
              bVar9 = IsForcePlateMomentChannel(this_00,rChannel);
              pVVar8 = local_80;
              if (bVar9) {
                pVVar17 = (local_80->m_LatestFrame).m_Moments.
                          super__Vector_base<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pVVar5 = (local_80->m_LatestFrame).m_Moments.
                         super__Vector_base<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                *local_c0 = 0;
                bVar23 = pVVar17 != pVVar5;
                if (pVVar17 == pVVar5) goto LAB_0012f67c;
                uVar22 = (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
                bVar23 = true;
                goto LAB_0012f478;
              }
              bVar9 = IsForcePlateCoPChannel(this_00,rChannel);
              if (!bVar9) {
                pVVar19 = (pVVar8->m_LatestFrame).m_Voltages.
                          super__Vector_base<ViconCGStream::VVoltageFrame,_std::allocator<ViconCGStream::VVoltageFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pVVar7 = (pVVar8->m_LatestFrame).m_Voltages.
                         super__Vector_base<ViconCGStream::VVoltageFrame,_std::allocator<ViconCGStream::VVoltageFrame>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                *local_c0 = 0;
                bVar23 = pVVar19 != pVVar7;
                if (pVVar19 == pVVar7) goto LAB_0012f67c;
                uVar22 = (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
                bVar23 = true;
                goto LAB_0012f56c;
              }
              pVVar18 = (pVVar8->m_LatestFrame).m_CentresOfPressure.
                        super__Vector_base<ViconCGStream::VCentreOfPressureFrame,_std::allocator<ViconCGStream::VCentreOfPressureFrame>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pVVar6 = (pVVar8->m_LatestFrame).m_CentresOfPressure.
                       super__Vector_base<ViconCGStream::VCentreOfPressureFrame,_std::allocator<ViconCGStream::VCentreOfPressureFrame>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              *local_c0 = 0;
              bVar23 = pVVar18 != pVVar6;
              if (pVVar18 == pVVar6) goto LAB_0012f67c;
              uVar22 = (long)(rChannel->m_ComponentNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(rChannel->m_ComponentNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              bVar23 = true;
              goto LAB_0012f4f8;
            }
            i_rDeviceOutputName_00 = i_rDeviceOutputName_00 + 1;
            i_DeviceOutputIndex = i_DeviceOutputIndex + 1;
          } while (i_rDeviceOutputName_00 != psVar3);
          bVar9 = false;
        }
      }
      goto LAB_0012f693;
    }
LAB_0012f6a7:
    EVar21 = InvalidDeviceOutputName;
  }
LAB_0012f6b2:
  if (local_60.is_locked == true) {
    boost::recursive_mutex::unlock(local_60.m);
  }
  return EVar21;
  while( true ) {
    pVVar16 = pVVar16 + 1;
    bVar23 = pVVar16 != pVVar4;
    if (!bVar23) break;
LAB_0012f3ee:
    if (((pVVar16->m_DeviceID == rChannel->m_DeviceID) &&
        (pVVar16->m_ChannelID == rChannel->m_ChannelID)) &&
       (uVar14 = (long)(pVVar16->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pVVar16->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2, uVar22 - 1 < uVar14)) {
      if (uVar14 % uVar22 != 0) {
        pcVar20 = 
        "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VForceFrame]"
        ;
        goto LAB_0012f785;
      }
      uVar15 = local_90 / (uVar14 / uVar22);
      if (local_90 % (uVar14 / uVar22) == 0) goto LAB_0012f632;
      pcVar20 = 
      "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VForceFrame]"
      ;
      goto LAB_0012f7a4;
    }
  }
  goto LAB_0012f67c;
  while( true ) {
    pVVar17 = pVVar17 + 1;
    bVar23 = pVVar17 != pVVar5;
    if (!bVar23) break;
LAB_0012f478:
    if (((pVVar17->m_DeviceID == rChannel->m_DeviceID) &&
        (pVVar17->m_ChannelID == rChannel->m_ChannelID)) &&
       (uVar14 = (long)(pVVar17->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pVVar17->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2, uVar22 - 1 < uVar14)) {
      if (uVar14 % uVar22 != 0) {
        pcVar20 = 
        "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VMomentFrame]"
        ;
        goto LAB_0012f785;
      }
      uVar15 = local_90 / (uVar14 / uVar22);
      if (local_90 % (uVar14 / uVar22) == 0) goto LAB_0012f632;
      pcVar20 = 
      "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VMomentFrame]"
      ;
      goto LAB_0012f7a4;
    }
  }
  goto LAB_0012f67c;
  while( true ) {
    pVVar18 = pVVar18 + 1;
    bVar23 = pVVar18 != pVVar6;
    if (!bVar23) break;
LAB_0012f4f8:
    if (((pVVar18->m_DeviceID == rChannel->m_DeviceID) &&
        (pVVar18->m_ChannelID == rChannel->m_ChannelID)) &&
       (uVar14 = (long)(pVVar18->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pVVar18->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2, uVar22 - 1 < uVar14)) {
      if (uVar14 % uVar22 != 0) {
        pcVar20 = 
        "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VCentreOfPressureFrame]"
        ;
        goto LAB_0012f785;
      }
      uVar15 = local_90 / (uVar14 / uVar22);
      if (local_90 % (uVar14 / uVar22) == 0) goto LAB_0012f632;
      pcVar20 = 
      "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VCentreOfPressureFrame]"
      ;
      goto LAB_0012f7a4;
    }
  }
LAB_0012f67c:
  bVar9 = true;
  *local_70 = (bool)(~bVar23 & 1);
  local_b4 = Success;
LAB_0012f693:
  EVar21 = local_b4;
  if (bVar9) goto LAB_0012f6b2;
  rChannel = rChannel + 1;
  if (rChannel == local_68) goto LAB_0012f6a7;
  goto LAB_0012f2b5;
LAB_0012f56c:
  if (((pVVar19->m_DeviceID != rChannel->m_DeviceID) ||
      (pVVar19->m_ChannelID != rChannel->m_ChannelID)) ||
     (uVar14 = (long)(pVVar19->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pVVar19->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2, uVar14 <= uVar22 - 1))
  goto LAB_0012f58d;
  if (uVar14 % uVar22 != 0) {
    pcVar20 = 
    "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VVoltageFrame]"
    ;
LAB_0012f785:
    __assert_fail("NumberOfSampleComponents % Components == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCore/CoreClient.cpp"
                  ,0xeed,pcVar20);
  }
  uVar15 = local_90 / (uVar14 / uVar22);
  if (local_90 % (uVar14 / uVar22) != 0) {
    pcVar20 = 
    "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VVoltageFrame]"
    ;
LAB_0012f7a4:
    __assert_fail("i_DevicePeriod % NumSamples == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCore/CoreClient.cpp"
                  ,0xef1,pcVar20);
  }
LAB_0012f632:
  if (local_a0 < UVar13) {
    iVar10 = 0;
  }
  else {
    iVar10 = (int)((local_b0 + uVar15) / uVar15);
  }
  if (local_98 < UVar13) {
    iVar11 = 0;
  }
  else {
    iVar11 = (int)((uVar15 + local_a8) / uVar15);
  }
  *local_c0 = iVar11 - iVar10;
  goto LAB_0012f67c;
LAB_0012f58d:
  pVVar19 = pVVar19 + 1;
  bVar23 = pVVar19 != pVVar7;
  if (!bVar23) goto LAB_0012f67c;
  goto LAB_0012f56c;
}

Assistant:

Result::Enum VClient::GetDeviceOutputSubsamples( const std::string  & i_rDeviceName,
                                                 const std::string  & i_rDeviceOutputName, 
                                                 const std::string  & i_rComponentName,
                                                       unsigned int & o_rDeviceOutputSubsamples,
                                                       bool         & o_rbOccluded ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rDeviceOutputSubsamples ) )
  {
    return GetResult; 
  }

  const ViconCGStream::VDeviceInfo * pDevice = GetDevice( i_rDeviceName, GetResult );
  if ( !pDevice )
  {
    return GetResult; 
  }
  const unsigned int DeviceID = pDevice->m_DeviceID;
  const ViconCGStreamType::UInt64 DevicePeriod = pDevice->m_FramePeriod;

  ViconCGStreamType::Int64 DeviceStartTick = GetDeviceStartTick( DeviceID );

  const TPeriod FramePeriod = GetFramePeriod( m_LatestFrame );

  // Iterate over the channels for this device
  unsigned int CurrentDeviceOutputIndex = 0;
  std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelIt  = m_LatestFrame.m_Channels.begin();
  std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelEnd = m_LatestFrame.m_Channels.end();
  for ( ; ChannelIt != ChannelEnd; ++ChannelIt )
  {
    const ViconCGStream::VChannelInfo & rChannel( *ChannelIt );

    // Wrong device
    if ( rChannel.m_DeviceID != DeviceID )
    {
      continue;
    }

    if ( !i_rDeviceOutputName.empty() )
    {
      if ( rChannel.m_Name != i_rDeviceOutputName )
      {
        continue;
      }
    }

    if( rChannel.m_ComponentNames.empty() )
    {
      return Result::NoFrame;
    }

    std::vector< std::string >::const_iterator ComponentIt  = rChannel.m_ComponentNames.begin();
    std::vector< std::string >::const_iterator ComponentEnd = rChannel.m_ComponentNames.end();
    for( unsigned int ComponentIndex = 0 ; ComponentIt != ComponentEnd ; ++ComponentIt, ++ComponentIndex, ++CurrentDeviceOutputIndex )
    {
      if( i_rComponentName == AdaptDeviceOutputName( *ComponentIt, CurrentDeviceOutputIndex ) )
      {
        // This is the correct component.
        // Find the correct data array.

        if( IsForcePlateForceChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Forces, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else if( IsForcePlateMomentChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Moments, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else if( IsForcePlateCoPChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_CentresOfPressure, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Voltages, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }

        return Result::Success;
      }
    }
  }

  return Result::InvalidDeviceOutputName;
}